

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O0

void draw_roundtangle_fill
               (Am_Drawonable_Impl *d,int left,int top,int width,int height,int right,int bottom,
               unsigned_short x_radius,unsigned_short y_radius,int thickness,int half_thickness,
               int th2,int corner_width,int corner_height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_8c;
  int i;
  int y2_aux;
  int x2_aux;
  int middle_fill_height;
  int middle_fill_width;
  int side_fill_height;
  int side_fill_width;
  int arc_fill_height;
  int arc_fill_width;
  int y1_rad;
  int x1_rad;
  int y1_aux;
  int x1_aux;
  XArc arc [4];
  int right_local;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  Am_Drawonable_Impl *d_local;
  
  iVar1 = left + half_thickness * 2;
  iVar2 = top + half_thickness * 2;
  iVar3 = thickness + half_thickness * 2;
  iVar4 = (uint)x_radius - half_thickness;
  iVar5 = height - corner_height;
  arc[3]._8_4_ = right;
  if ((0 < iVar4) && (0 < iVar5)) {
    XFillRectangle(d->screen->display,d->xlib_drawable,d->screen->gc,iVar1,top + (uint)y_radius,
                   iVar4,iVar5);
    XFillRectangle(d->screen->display,d->xlib_drawable,d->screen->gc,
                   (arc[3]._8_4_ - iVar4) - thickness,top + (uint)y_radius,iVar4,iVar5);
  }
  if ((0 < width - corner_width) && (0 < height - iVar3)) {
    XFillRectangle(d->screen->display,d->xlib_drawable,d->screen->gc,left + (uint)x_radius,iVar2,
                   width - corner_width,height - iVar3);
  }
  if ((0 < corner_width - iVar3) && (0 < corner_height - iVar3)) {
    arc[1].width = ((short)arc[3]._8_4_ - (short)corner_width) + (short)half_thickness * 2;
    arc[0].height = ((short)bottom - (short)corner_height) + (short)half_thickness * 2;
    for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
      arc[(long)local_8c + -1].angle1 = (short)(corner_width - iVar3);
      arc[(long)local_8c + -1].angle2 = (short)(corner_height - iVar3);
      arc[local_8c].y = 0x1680;
    }
    y1_aux._0_2_ = (unsigned_short)iVar1;
    y1_aux._2_2_ = (unsigned_short)iVar2;
    arc[0].x = 0x1680;
    arc[1].x = 0x2d00;
    arc[2].x = 0x4380;
    arc[3].x = 0;
    arc[0].width = (unsigned_short)y1_aux;
    arc[1].height = arc[0].height;
    arc[2].width = arc[1].width;
    arc[2].height = y1_aux._2_2_;
    XFillArcs(d->screen->display,d->xlib_drawable,d->screen->gc,&y1_aux,4);
  }
  return;
}

Assistant:

void
draw_roundtangle_fill(Am_Drawonable_Impl *d, int left, int top, int width,
                      int height, int right, int bottom,
                      unsigned short x_radius, unsigned short y_radius,
                      int thickness, int half_thickness, int th2,
                      int corner_width, int corner_height)
{
  XArc arc[4];
  // more hackery.  see Draw_Arc for an explanation of why this is necessary.
  // Nov 7 1995 af1x
  int x1_aux = left + 2 * half_thickness;
  int y1_aux = top + 2 * half_thickness;
  int x1_rad = left + x_radius;
  int y1_rad = top + y_radius;
  th2 = thickness + 2 * half_thickness;
  int arc_fill_width = corner_width - th2;
  int arc_fill_height = corner_height - th2;
  int side_fill_width = x_radius - half_thickness;
  int side_fill_height = height - corner_height;
  int middle_fill_width = width - corner_width;
  int middle_fill_height = height - th2;

  if ((side_fill_width > 0) && (side_fill_height > 0)) {
    // Left
    XFillRectangle(d->screen->display, d->xlib_drawable, d->screen->gc, x1_aux,
                   y1_rad, side_fill_width, side_fill_height);
    // Right
    XFillRectangle(d->screen->display, d->xlib_drawable, d->screen->gc,
                   (right - side_fill_width - thickness), y1_rad,
                   side_fill_width, side_fill_height);
  }

  if ((middle_fill_width > 0) && (middle_fill_height > 0)) {
    // Middle
    XFillRectangle(d->screen->display, d->xlib_drawable, d->screen->gc, x1_rad,
                   y1_aux, middle_fill_width, middle_fill_height);
  }

  if ((arc_fill_width > 0) && (arc_fill_height > 0)) {
    int x2_aux = right - corner_width + 2 * half_thickness;
    int y2_aux = bottom - corner_height + 2 * half_thickness;
    for (int i = 0; i < 4; i++) {
      arc[i].width = arc_fill_width;
      arc[i].height = arc_fill_height;
      arc[i].angle2 = Am_90_DEGREES;
    }
    // Top left
    arc[0].x = x1_aux;
    arc[0].y = y1_aux;
    arc[0].angle1 = Am_90_DEGREES;
    // Bottom left
    arc[1].x = x1_aux;
    arc[1].y = y2_aux;
    arc[1].angle1 = Am_180_DEGREES;
    // Bottom right
    arc[2].x = x2_aux;
    arc[2].y = y2_aux;
    arc[2].angle1 = Am_270_DEGREES;
    // Top right
    arc[3].x = x2_aux;
    arc[3].y = y1_aux;
    arc[3].angle1 = Am_0_DEGREES;
    XFillArcs(d->screen->display, d->xlib_drawable, d->screen->gc, arc, 4);
  }
}